

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

QMetaEnum metaEnumFromType(QMetaType t)

{
  Data *pDVar1;
  bool bVar2;
  int index;
  QMetaObject *this;
  qsizetype qVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QMetaEnum QVar5;
  QArrayDataPointer<char> local_68;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((t.d_ptr != (QMetaTypeInterface *)0x0) && (((t.d_ptr)->flags & 0x10) != 0)) &&
     ((t.d_ptr)->metaObjectFn != (MetaObjectFn)0x0)) {
    this = (*(t.d_ptr)->metaObjectFn)(t.d_ptr);
    if (this != (QMetaObject *)0x0) {
      qVar3 = QByteArrayView::lengthHelperCharArray("QFlags<",8);
      local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray((QByteArray *)&local_48,(t.d_ptr)->name,-1);
      if (((undefined1 *)local_48.size != (undefined1 *)0x0) &&
         (local_48.ptr[(long)(local_48.size + -1)] == '>')) {
        bv.m_data = "QFlags<";
        bv.m_size = qVar3;
        bVar2 = QByteArray::startsWith((QByteArray *)&local_48,bv);
        if (bVar2) {
          QByteArray::chop((QByteArray *)&local_48,1);
          QByteArray::sliced((QByteArray *)&local_68,(QByteArray *)&local_48,qVar3);
          qVar3 = local_48.size;
          pcVar4 = local_48.ptr;
          pDVar1 = local_48.d;
          local_48.d = local_68.d;
          local_48.ptr = local_68.ptr;
          local_68.d = pDVar1;
          local_68.ptr = pcVar4;
          local_48.size = local_68.size;
          local_68.size = qVar3;
          QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
        }
      }
      qVar3 = QByteArray::lastIndexOf((QByteArray *)&local_48,':',-1);
      if (qVar3 != -1) {
        QByteArray::sliced((QByteArray *)&local_68,(QByteArray *)&local_48,qVar3 + 1);
        qVar3 = local_48.size;
        pcVar4 = local_48.ptr;
        pDVar1 = local_48.d;
        local_48.d = local_68.d;
        local_48.ptr = local_68.ptr;
        local_68.d = pDVar1;
        local_68.ptr = pcVar4;
        local_48.size = local_68.size;
        local_68.size = qVar3;
        QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      }
      pcVar4 = local_48.ptr;
      if (local_48.ptr == (char *)0x0) {
        pcVar4 = &QByteArray::_empty;
      }
      index = QMetaObject::indexOfEnumerator(this,pcVar4);
      QVar5 = QMetaObject::enumerator(this,index);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
      goto LAB_0027437e;
    }
  }
  QVar5 = (QMetaEnum)ZEXT816(0);
LAB_0027437e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

static QMetaEnum metaEnumFromType(QMetaType t)
{
    if (t.flags() & QMetaType::IsEnumeration) {
        if (const QMetaObject *metaObject = t.metaObject()) {
            QByteArrayView qflagsNamePrefix = "QFlags<";
            QByteArray enumName = t.name();
            if (enumName.endsWith('>') && enumName.startsWith(qflagsNamePrefix)) {
                // extract the template argument
                enumName.chop(1);
                enumName = enumName.sliced(qflagsNamePrefix.size());
            }
            if (qsizetype lastColon = enumName.lastIndexOf(':'); lastColon != -1)
                enumName = enumName.sliced(lastColon + 1);
            return metaObject->enumerator(metaObject->indexOfEnumerator(enumName));
        }
    }
    return QMetaEnum();
}